

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t b_open(ion_bpp_open_t info,ion_bpp_handle_t *handle)

{
  undefined8 *puVar1;
  ion_boolean_t iVar2;
  ion_err_t iVar3;
  int iVar4;
  ion_bpp_err_t iVar5;
  undefined8 *__ptr;
  void *pvVar6;
  void *pvVar7;
  ion_file_handle_t pFVar8;
  ion_file_offset_t iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ion_bpp_buffer_t *root;
  ion_bpp_buffer_t *local_38;
  
  iVar5 = bErrSectorSize;
  if (((undefined1  [32])info & (undefined1  [32])0x3) == (undefined1  [32])0x0 &&
      199 < info.sectorSize) {
    iVar4 = (int)info.sectorSize;
    iVar12 = (int)((ulong)(long)(iVar4 + -0x27) / ((long)info.keySize + 0x10U));
    if (5 < iVar12) {
      __ptr = (undefined8 *)calloc(1,200);
      if (__ptr == (undefined8 *)0x0) {
        iVar5 = bErrMemory;
        if (bErrLineNo == 0) {
          bErrLineNo = 0x3a0;
        }
      }
      else {
        *(int *)(__ptr + 1) = info.keySize;
        *(ion_bpp_bool_t *)((long)__ptr + 0xc) = info.dupKeys;
        *(int *)(__ptr + 2) = iVar4;
        __ptr[3] = info.comp;
        *(int *)((long)__ptr + 0xbc) = info.keySize + 0x10;
        *(int *)(__ptr + 0x17) = iVar12;
        pvVar6 = calloc(7,0x28);
        __ptr[0xe] = pvVar6;
        if (pvVar6 == (void *)0x0) {
          iVar5 = bErrMemory;
          if (bErrLineNo == 0) {
            bErrLineNo = 0x3b6;
          }
        }
        else {
          pvVar7 = malloc((long)(iVar4 * 0xd + (info.keySize + 0x10) * 2));
          __ptr[0xf] = pvVar7;
          if (pvVar7 == (void *)0x0) {
            iVar5 = bErrMemory;
            if (bErrLineNo == 0) {
              bErrLineNo = 0x3c4;
            }
          }
          else {
            iVar4 = *(int *)(__ptr + 2);
            iVar12 = *(int *)((long)__ptr + 0xbc) * 2;
            iVar10 = iVar12 + iVar4 * 0xd;
            if (iVar10 != 0 && SCARRY4(iVar12,iVar4 * 0xd) == iVar10 < 0) {
              lVar11 = 0;
              do {
                *(undefined1 *)(__ptr[0xf] + lVar11) = 0;
                lVar11 = lVar11 + 1;
                iVar4 = *(int *)(__ptr + 2);
              } while (lVar11 < (long)iVar4 * 0xd + (long)*(int *)((long)__ptr + 0xbc) * 2);
            }
            lVar11 = __ptr[0xf];
            __ptr[9] = pvVar6;
            __ptr[10] = (long)pvVar6 + 0xf0;
            iVar12 = 7;
            puVar1 = (undefined8 *)pvVar6;
            do {
              *puVar1 = puVar1 + 5;
              puVar1[1] = puVar1 + -5;
              puVar1[4] = 0;
              puVar1[3] = lVar11;
              lVar11 = lVar11 + iVar4;
              iVar12 = iVar12 + -1;
              puVar1 = puVar1 + 5;
            } while (iVar12 != 0);
            *(undefined8 **)((long)pvVar6 + 8) = __ptr + 9;
            *(undefined8 **)((long)pvVar6 + 0xf0) = __ptr + 9;
            local_38 = (ion_bpp_buffer_t *)(__ptr + 4);
            __ptr[7] = lVar11;
            __ptr[0x13] = iVar4 * 3 + lVar11;
            __ptr[0x15] = 0;
            __ptr[0x16] = 0;
            iVar2 = ion_fexists(info.iName);
            pFVar8 = ion_fopen(info.iName);
            *__ptr = pFVar8;
            if (iVar2 == '\0') {
              if (pFVar8 == (ion_file_handle_t)0x0) {
                free(__ptr);
                return bErrFileNotOpen;
              }
              memset((void *)__ptr[7],0,(long)*(int *)(__ptr + 2) * 3);
              *(ushort *)__ptr[7] = *(ushort *)__ptr[7] | 1;
              __ptr[0x18] = (long)*(int *)(__ptr + 2) * 3;
              *(undefined4 *)((long)__ptr + 0x44) = 1;
              flushAll(__ptr);
            }
            else {
              iVar5 = readDisk(__ptr,0,&local_38);
              if (iVar5 != bErrOk) {
                return iVar5;
              }
              iVar3 = ion_fseek((ion_file_handle_t)*__ptr,0,2);
              if (iVar3 != '\0') {
                if (bErrLineNo != 0) {
                  return bErrIO;
                }
                bErrLineNo = 0x3f1;
                return bErrIO;
              }
              iVar9 = ion_ftell((ion_file_handle_t)*__ptr);
              __ptr[0x18] = iVar9;
              if (iVar9 == -1) {
                if (bErrLineNo != 0) {
                  return bErrIO;
                }
                bErrLineNo = 0x3f5;
                return bErrIO;
              }
            }
            *handle = __ptr;
            iVar5 = bErrOk;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

ion_bpp_err_t
b_open(
	ion_bpp_open_t		info,
	ion_bpp_handle_t	*handle
) {
	ion_bpp_h_node_t	*h;
	ion_bpp_err_t		rc;			/* return code */
	int					bufCt;	/* number of tmp buffers */
	ion_bpp_buffer_t	*buf;				/* buffer */
	int					maxCt;	/* maximum number of keys in a node */
	ion_bpp_buffer_t	*root;
	int					i;
	ion_bpp_node_t		*p;

	if ((info.sectorSize < sizeof(ion_bpp_h_node_t)) || (0 != info.sectorSize % 4)) {
		return bErrSectorSize;
	}

	/* determine sizes and offsets */
	/* leaf/n, prev, next, [childLT,key,rec]... childGE */
	/* ensure that there are at least 3 children/parent for gather/scatter */
	maxCt	= info.sectorSize - (sizeof(ion_bpp_node_t) - sizeof(ion_bpp_key_t));
	maxCt	/= sizeof(ion_bpp_address_t) + info.keySize + sizeof(ion_bpp_external_address_t);

	if (maxCt < 6) {
		return bErrSectorSize;
	}

	/* copy parms to ion_bpp_h_node_t */
	if ((h = calloc(1, sizeof(ion_bpp_h_node_t))) == NULL) {
		return error(bErrMemory);
	}

	h->keySize		= info.keySize;
	h->dupKeys		= info.dupKeys;
	h->sectorSize	= info.sectorSize;
	h->comp			= info.comp;

	/* childLT, key, rec */
	h->ks			= sizeof(ion_bpp_address_t) + h->keySize + sizeof(ion_bpp_external_address_t);
	h->maxCt		= maxCt;

	/* Allocate buflist.
	 * During insert/delete, need simultaneous access to 7 buffers:
	 *  - 4 adjacent child bufs
	 *  - 1 parent buf
	 *  - 1 next sequential link
	 *  - 1 lastGE
	*/
	bufCt			= 7;

	if ((h->malloc1 = calloc(bufCt, sizeof(ion_bpp_buffer_t))) == NULL) {
		return error(bErrMemory);
	}

	buf = h->malloc1;

	/*
	 * Allocate bufs.
	 * We need space for the following:
	 *  - bufCt buffers, of size sectorSize
	 *  - 1 buffer for root, of size 3*sectorSize
	 *  - 1 buffer for gbuf, size 3*sectorsize + 2 extra keys
	 *	to allow for LT pointers in last 2 nodes when gathering 3 full nodes
	*/
	if ((h->malloc2 = malloc((bufCt + 6) * h->sectorSize + 2 * h->ks)) == NULL) {
		return error(bErrMemory);
	}

	for (i = 0; i < (bufCt + 6) * h->sectorSize + 2 * h->ks; i++) {
		((char *) h->malloc2)[i] = 0;
	}

	p				= h->malloc2;

	/* initialize buflist */
	h->bufList.next = buf;
	h->bufList.prev = buf + (bufCt - 1);

	for (i = 0; i < bufCt; i++) {
		buf->next		= buf + 1;
		buf->prev		= buf - 1;
		buf->modified	= boolean_false;
		buf->valid		= boolean_false;
		buf->p			= p;
		p				= (ion_bpp_node_t *) ((char *) p + h->sectorSize);
		buf++;
	}

	h->bufList.next->prev	= &h->bufList;
	h->bufList.prev->next	= &h->bufList;

	/* initialize root */
	root					= &h->root;
	root->p					= p;
	p						= (ion_bpp_node_t *) ((char *) p + 3 * h->sectorSize);
	h->gbuf.p				= p;/* done last to include extra 2 keys */

	h->curBuf				= NULL;
	h->curKey				= NULL;

	/* initialize root */
	if (ion_fexists(info.iName)) {
		/* open an existing database */
		h->fp = ion_fopen(info.iName);

		if ((rc = readDisk(h, 0, &root)) != 0) {
			return rc;
		}

		if (ion_fseek(h->fp, 0, ION_FILE_END)) {
			return error(bErrIO);
		}

		if ((h->nextFreeAdr = ion_ftell(h->fp)) == -1) {
			return error(bErrIO);
		}
	}

#if defined(ARDUINO)
	else if (NULL != (h->fp = ion_fopen(info.iName)).file) {
#else
	else if (NULL != (h->fp = ion_fopen(info.iName))) {
#endif
		/* initialize root */
		memset(root->p, 0, 3 * h->sectorSize);
		leaf(root)		= 1;
		h->nextFreeAdr	= 3 * h->sectorSize;
		root->modified	= 1;
		flushAll(h);
	}